

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_loop_close(uv_loop_t *loop)

{
  void *pvVar1;
  void **ppvVar2;
  
  if (loop->active_reqs != (void **)loop->active_reqs[0]) {
    return -0x10;
  }
  ppvVar2 = loop->handle_queue;
  do {
    ppvVar2 = (void **)*ppvVar2;
    if (ppvVar2 == loop->handle_queue) {
      uv__loop_close(loop);
      pvVar1 = loop->data;
      memset(&loop->active_handles,0xff,0x348);
      loop->data = pvVar1;
      if (default_loop_ptr != loop) {
        return 0;
      }
      default_loop_ptr = (uv_loop_t *)0x0;
      return 0;
    }
  } while ((*(byte *)((long)ppvVar2 + 0x39) & 0x80) != 0);
  return -0x10;
}

Assistant:

int uv_loop_close(uv_loop_t* loop) {
  QUEUE* q;
  uv_handle_t* h;
#ifndef NDEBUG
  void* saved_data;
#endif

  if (!QUEUE_EMPTY(&(loop)->active_reqs))
    return UV_EBUSY;

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);
    if (!(h->flags & UV__HANDLE_INTERNAL))
      return UV_EBUSY;
  }

  uv__loop_close(loop);

#ifndef NDEBUG
  saved_data = loop->data;
  memset(loop, -1, sizeof(*loop));
  loop->data = saved_data;
#endif
  if (loop == default_loop_ptr)
    default_loop_ptr = NULL;

  return 0;
}